

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int s_mp_add(mp_int *a,mp_int *b,mp_int *c)

{
  uint uVar1;
  uint uVar2;
  mp_digit *pmVar3;
  mp_digit *pmVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  mp_digit *pmVar8;
  int size;
  ulong uVar9;
  ulong uVar10;
  mp_digit mVar11;
  mp_int *pmVar12;
  ulong uVar13;
  
  uVar1 = a->used;
  uVar2 = b->used;
  pmVar12 = b;
  if ((int)uVar2 < (int)uVar1) {
    pmVar12 = a;
  }
  uVar5 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar5 = uVar1;
  }
  uVar6 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar6 = uVar1;
  }
  size = uVar6 + 1;
  if ((c->alloc <= (int)uVar6) && (iVar7 = mp_grow(c,size), iVar7 != 0)) {
    return iVar7;
  }
  iVar7 = c->used;
  c->used = size;
  pmVar3 = a->dp;
  pmVar4 = b->dp;
  pmVar8 = c->dp;
  uVar10 = 0;
  uVar13 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar13 = uVar10;
  }
  mVar11 = 0;
  for (; (int)uVar13 != (int)uVar10; uVar10 = uVar10 + 1) {
    uVar9 = mVar11 + pmVar3[uVar10] + pmVar4[uVar10];
    mVar11 = uVar9 >> 0x3c;
    *pmVar8 = uVar9 & 0xfffffffffffffff;
    pmVar8 = pmVar8 + 1;
  }
  if (uVar2 != uVar1) {
    for (; (long)uVar13 < (long)(int)uVar6; uVar13 = uVar13 + 1) {
      uVar10 = mVar11 + pmVar12->dp[uVar13];
      mVar11 = uVar10 >> 0x3c;
      *pmVar8 = uVar10 & 0xfffffffffffffff;
      pmVar8 = pmVar8 + 1;
    }
  }
  *pmVar8 = mVar11;
  for (; pmVar8 = pmVar8 + 1, size < iVar7; size = size + 1) {
    *pmVar8 = 0;
  }
  mp_clamp(c);
  return 0;
}

Assistant:

int s_mp_add (mp_int * a, mp_int * b, mp_int * c)
{
  mp_int *x;
  int     olduse, res, min, max;

  /* find sizes, we let |a| <= |b| which means we have to sort
   * them.  "x" will point to the input with the most digits
   */
  if (a->used > b->used) {
    min = b->used;
    max = a->used;
    x = a;
  } else {
    min = a->used;
    max = b->used;
    x = b;
  }

  /* init result */
  if (c->alloc < max + 1) {
    if ((res = mp_grow (c, max + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* get old used digit count and set new one */
  olduse = c->used;
  c->used = max + 1;

  {
    register mp_digit u, *tmpa, *tmpb, *tmpc;
    register int i;

    /* alias for digit pointers */

    /* first input */
    tmpa = a->dp;

    /* second input */
    tmpb = b->dp;

    /* destination */
    tmpc = c->dp;

    /* zero the carry */
    u = 0;
    for (i = 0; i < min; i++) {
      /* Compute the sum at one digit, T[i] = A[i] + B[i] + U */
      *tmpc = *tmpa++ + *tmpb++ + u;

      /* U = carry bit of T[i] */
      u = *tmpc >> ((mp_digit)DIGIT_BIT);

      /* take away carry bit from T[i] */
      *tmpc++ &= MP_MASK;
    }

    /* now copy higher words if any, that is in A+B 
     * if A or B has more digits add those in 
     */
    if (min != max) {
      for (; i < max; i++) {
        /* T[i] = X[i] + U */
        *tmpc = x->dp[i] + u;

        /* U = carry bit of T[i] */
        u = *tmpc >> ((mp_digit)DIGIT_BIT);

        /* take away carry bit from T[i] */
        *tmpc++ &= MP_MASK;
      }
    }

    /* add carry */
    *tmpc++ = u;

    /* clear digits above oldused */
    for (i = c->used; i < olduse; i++) {
      *tmpc++ = 0;
    }
  }

  mp_clamp (c);
  return MP_OKAY;
}